

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O3

bool __thiscall
QMarkdownTextEdit::increaseSelectedTextIndention
          (QMarkdownTextEdit *this,bool reverse,QString *indentCharacters)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  qsizetype qVar3;
  Data *pDVar4;
  QRegularExpression QVar5;
  char cVar6;
  MoveMode MVar7;
  MoveMode MVar8;
  int iVar9;
  QString *pQVar10;
  longlong lVar11;
  char16_t *pcVar12;
  int iVar13;
  long lVar14;
  QByteArrayView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QString t_2;
  QTextCursor cursor;
  QString t_1;
  QString t;
  QString newText;
  QString newLine;
  QByteArray local_148;
  QArrayData *local_130;
  QByteArrayView local_128;
  storage_type_conflict *psStack_118;
  QRegularExpression local_110;
  char16_t *local_108;
  storage_type_conflict *psStack_100;
  QString local_f8;
  QArrayData *local_d8;
  char16_t *local_d0;
  undefined8 local_c8;
  QRegularExpression local_c0;
  char16_t *local_b8;
  undefined8 local_b0;
  QRegularExpression local_a8;
  char16_t *pcStack_a0;
  long lStack_98;
  QMarkdownTextEdit *local_88;
  QRegularExpression local_80;
  char16_t *local_78;
  undefined8 local_70;
  QRegularExpression local_68;
  QRegularExpression local_60;
  char *local_58;
  storage_type_conflict *psStack_50;
  QArrayData *local_48;
  char16_t *local_40;
  undefined8 local_38;
  
  local_88 = this;
  QPlainTextEdit::textCursor();
  QTextCursor::selectedText();
  if (lStack_98 == 0) {
    if (reverse) {
      iVar9 = (int)(indentCharacters->d).size;
      if (0 < iVar9) {
        do {
          MVar7 = QTextCursor::position();
          cVar6 = QTextCursor::atStart();
          iVar13 = (int)&local_130;
          if (cVar6 == '\0') {
            QTextCursor::setPosition(iVar13,MVar7 - KeepAnchor);
          }
          local_148.d.d = (Data *)0x0;
          local_148.d.ptr = "[\\t ]";
          local_148.d.size = 5;
          QRegularExpression::QRegularExpression(&local_60,&local_148,0);
          if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
            }
          }
          QTextCursor::selectedText();
          QRegularExpression::match((QRegularExpressionMatch *)&local_f8,&local_60,&local_148,0,0,0)
          ;
          if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
            }
          }
          cVar6 = QRegularExpressionMatch::hasMatch();
          if (cVar6 == '\0') {
            QTextCursor::setPosition(iVar13,MVar7);
            cVar6 = QTextCursor::atEnd();
            if (cVar6 == '\0') {
              QTextCursor::setPosition(iVar13,MVar7 + KeepAnchor);
            }
          }
          QTextCursor::selectedText();
          QRegularExpression::match(&local_128,&local_60,&local_148,0,0,0);
          pDVar4 = local_f8.d.d;
          local_f8.d.d = (Data *)local_128.m_size;
          local_128.m_size = (qsizetype)pDVar4;
          QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_128);
          if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
            }
          }
          cVar6 = QRegularExpressionMatch::hasMatch();
          if (cVar6 != '\0') {
            QTextCursor::removeSelectedText();
          }
          QPlainTextEdit::textCursor();
          pQVar1 = local_130;
          local_130 = &(local_148.d.d)->super_QArrayData;
          local_148.d.d = (Data *)pQVar1;
          QTextCursor::~QTextCursor((QTextCursor *)&local_148);
          QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_f8);
          QRegularExpression::~QRegularExpression(&local_60);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
    }
    else {
      QTextCursor::insertText((QString *)&local_130);
    }
    goto LAB_0011594f;
  }
  MVar7 = QTextCursor::selectionEnd();
  MVar8 = QTextCursor::selectionStart();
  QTextCursor::setPosition((int)&local_130,MVar8);
  QTextCursor::movePosition((MoveOperation)&local_130,4,0);
  QTextCursor::setPosition((int)&local_130,MVar7);
  QPlainTextEdit::setTextCursor((QTextCursor *)local_88);
  QTextCursor::selectedText();
  pcVar12 = pcStack_a0;
  QVar5.d.d = local_a8.d.d;
  qVar3 = local_148.d.size;
  pDVar2 = local_148.d.d;
  local_148.d.d = (Data *)local_a8.d.d;
  local_a8.d.d = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
                 (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)pDVar2;
  pcStack_a0 = (char16_t *)local_148.d.ptr;
  local_148.d.ptr = (char *)pcVar12;
  local_148.d.size = lStack_98;
  lStack_98 = qVar3;
  if (QVar5.d.d != (QRegularExpressionPrivate *)0x0) {
    LOCK();
    *(int *)QVar5.d.d = *(int *)QVar5.d.d + -1;
    UNLOCK();
    if (*(int *)QVar5.d.d == 0) {
      QArrayData::deallocate((QArrayData *)QVar5.d.d,2,8);
    }
  }
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = L"e280a9";
  local_f8.d.size = 6;
  QByteArray::fromHex(&local_148);
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_128,&local_148);
  QVar15.m_data = (storage_type *)local_128.m_size;
  QVar15.m_size = (qsizetype)&local_60;
  QString::fromUtf8(QVar15);
  if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,1,8);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,8);
    }
  }
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = (char16_t *)0x0;
  local_f8.d.size = 0;
  if (reverse) {
    lVar14 = (indentCharacters->d).size;
    if ((lVar14 == 1) &&
       (QVar16.m_data = (indentCharacters->d).ptr, QVar16.m_size = 1, QVar18.m_data = L"\t",
       QVar18.m_size = 1, iVar9 = QtPrivate::compareStrings(QVar16,QVar18,CaseSensitive), iVar9 == 0
       )) {
      lVar14 = 4;
    }
    local_d8 = (QArrayData *)0x0;
    local_d0 = L"(\\t| {1,";
    local_c8 = 8;
    local_110.d.d = local_60.d.d;
    local_108 = (char16_t *)local_58;
    psStack_100 = psStack_50;
    if (local_60.d.d != (QRegularExpressionPrivate *)0x0) {
      LOCK();
      *(int *)local_60.d.d = *(int *)local_60.d.d + 1;
      UNLOCK();
    }
    QString::append((QString *)&local_110);
    QString::number((int)&local_c0,(int)lVar14);
    local_128.m_size = (qsizetype)local_110.d.d;
    local_128.m_data = (storage_type *)local_108;
    psStack_118 = psStack_100;
    if (local_110.d.d != (QRegularExpressionPrivate *)0x0) {
      LOCK();
      *(int *)local_110.d.d = *(int *)local_110.d.d + 1;
      UNLOCK();
    }
    QString::append((QString *)&local_128);
    local_80.d.d = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
                   (QRegularExpressionPrivate *)0x0;
    local_78 = L"})";
    local_70 = 2;
    local_148.d.d = (Data *)local_128.m_size;
    local_148.d.ptr = local_128.m_data;
    local_148.d.size = (qsizetype)psStack_118;
    if ((QArrayData *)local_128.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QString *)&local_148);
    QRegularExpression::QRegularExpression(&local_68,&local_148,0);
    local_48 = (QArrayData *)0x0;
    local_40 = L"\n";
    local_38 = 1;
    pQVar10 = (QString *)QString::replace(&local_a8,(QString *)&local_68);
    QString::operator=(&local_f8,pQVar10);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,8);
      }
    }
    QRegularExpression::~QRegularExpression(&local_68);
    if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_80.d.d != (QRegularExpressionPrivate *)0x0) {
      LOCK();
      *(int *)local_80.d.d = *(int *)local_80.d.d + -1;
      UNLOCK();
      if (*(int *)local_80.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_80.d.d,2,8);
      }
    }
    if ((QArrayData *)local_128.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_128.m_size,2,8);
      }
    }
    if (local_c0.d.d != (QRegularExpressionPrivate *)0x0) {
      LOCK();
      *(int *)local_c0.d.d = *(int *)local_c0.d.d + -1;
      UNLOCK();
      if (*(int *)local_c0.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_c0.d.d,2,8);
      }
    }
    if (local_110.d.d != (QRegularExpressionPrivate *)0x0) {
      LOCK();
      *(int *)local_110.d.d = *(int *)local_110.d.d + -1;
      UNLOCK();
      if (*(int *)local_110.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_110.d.d,2,8);
      }
    }
    if (local_d8 != (QArrayData *)0x0) {
      LOCK();
      (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d8,2,8);
      }
    }
    QString::number((int)&local_d8,(int)lVar14);
    local_110.d.d =
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)(QRegularExpressionPrivate *)0x0;
    local_108 = L"^(\\t| {1,";
    psStack_100 = (storage_type_conflict *)0x9;
    QString::append((QString *)&local_110);
    local_c0.d.d = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
                   (QRegularExpressionPrivate *)0x0;
    local_b8 = L"})";
    local_b0 = 2;
    local_128.m_size = (qsizetype)local_110.d.d;
    local_128.m_data = (storage_type *)local_108;
    psStack_118 = psStack_100;
    if (local_110.d.d != (QRegularExpressionPrivate *)0x0) {
      LOCK();
      *(int *)local_110.d.d = *(int *)local_110.d.d + 1;
      UNLOCK();
    }
    QString::append((QString *)&local_128);
    QRegularExpression::QRegularExpression(&local_80,&local_128,0);
    local_148.d.d = (Data *)0x0;
    local_148.d.ptr = (char *)0x0;
    local_148.d.size = 0;
    QString::replace((QRegularExpression *)&local_f8,(QString *)&local_80);
    if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
      }
    }
    QRegularExpression::~QRegularExpression(&local_80);
    if ((QArrayData *)local_128.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_128.m_size,2,8);
      }
    }
    if (local_c0.d.d != (QRegularExpressionPrivate *)0x0) {
      LOCK();
      *(int *)local_c0.d.d = *(int *)local_c0.d.d + -1;
      UNLOCK();
      if (*(int *)local_c0.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_c0.d.d,2,8);
      }
    }
    if (local_110.d.d != (QRegularExpressionPrivate *)0x0) {
      LOCK();
      *(int *)local_110.d.d = *(int *)local_110.d.d + -1;
      UNLOCK();
      if (*(int *)local_110.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_110.d.d,2,8);
      }
    }
    if (local_d8 != (QArrayData *)0x0) {
      LOCK();
      (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar9 = (local_d8->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar1 = local_d8;
joined_r0x0011589e:
      if (iVar9 == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
  }
  else {
    QVar17.m_data = psStack_50;
    QVar17.m_size = (qsizetype)&local_128;
    QRegularExpression::escape(QVar17);
    local_110.d.d =
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)(QRegularExpressionPrivate *)0x0;
    local_108 = L"$";
    psStack_100 = (storage_type_conflict *)0x1;
    local_148.d.d = (Data *)local_128.m_size;
    local_148.d.ptr = local_128.m_data;
    local_148.d.size = (qsizetype)psStack_118;
    if ((QArrayData *)local_128.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QString *)&local_148);
    QRegularExpression::QRegularExpression(&local_c0,&local_148,0);
    local_d8 = (QArrayData *)0x0;
    local_d0 = L"\n";
    local_c8 = 1;
    pQVar10 = (QString *)QString::replace(&local_a8,(QString *)&local_c0);
    QString::operator=(&local_f8,pQVar10);
    if (local_d8 != (QArrayData *)0x0) {
      LOCK();
      (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d8,2,8);
      }
    }
    QRegularExpression::~QRegularExpression(&local_c0);
    if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_110.d.d != (QRegularExpressionPrivate *)0x0) {
      LOCK();
      *(int *)local_110.d.d = *(int *)local_110.d.d + -1;
      UNLOCK();
      if (*(int *)local_110.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_110.d.d,2,8);
      }
    }
    if ((QArrayData *)local_128.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_128.m_size,2,8);
      }
    }
    local_148.d.d = (Data *)0x0;
    local_148.d.ptr = "\n";
    local_148.d.size = 1;
    QString::append((QString *)&local_148);
    lVar11 = QString::replace((QString *)&local_f8,(QString *)&local_60,(CaseSensitivity)&local_148)
    ;
    pcVar12 = (indentCharacters->d).ptr;
    if (pcVar12 == (char16_t *)0x0) {
      pcVar12 = (char16_t *)&QString::_empty;
    }
    QString::insert(lVar11,(QChar *)0x0,(longlong)pcVar12);
    if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
      }
    }
    local_128.m_size = 0;
    local_128.m_data = "\\t$";
    psStack_118 = (storage_type_conflict *)0x3;
    QRegularExpression::QRegularExpression(&local_110,&local_128,0);
    local_148.d.d = (Data *)0x0;
    local_148.d.ptr = (char *)0x0;
    local_148.d.size = 0;
    QString::replace((QRegularExpression *)&local_f8,(QString *)&local_110);
    if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
      }
    }
    QRegularExpression::~QRegularExpression(&local_110);
    if ((QArrayData *)local_128.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      iVar9 = (((QBasicAtomicInt *)local_128.m_size)->_q_value).super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar1 = (QArrayData *)local_128.m_size;
      goto joined_r0x0011589e;
    }
  }
  QTextCursor::insertText((QString *)&local_130);
  iVar9 = QTextCursor::position();
  QTextCursor::setPosition((int)&local_130,iVar9 - (int)local_f8.d.size);
  QPlainTextEdit::setTextCursor((QTextCursor *)local_88);
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_60.d.d != (QRegularExpressionPrivate *)0x0) {
    LOCK();
    *(int *)local_60.d.d = *(int *)local_60.d.d + -1;
    UNLOCK();
    if (*(int *)local_60.d.d == 0) {
      QArrayData::deallocate((QArrayData *)local_60.d.d,2,8);
    }
  }
LAB_0011594f:
  if (local_a8.d.d != (QRegularExpressionPrivate *)0x0) {
    LOCK();
    *(int *)local_a8.d.d = *(int *)local_a8.d.d + -1;
    UNLOCK();
    if (*(int *)local_a8.d.d == 0) {
      QArrayData::deallocate((QArrayData *)local_a8.d.d,2,8);
    }
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_130);
  return true;
}

Assistant:

bool QMarkdownTextEdit::increaseSelectedTextIndention(
    bool reverse, const QString &indentCharacters) {
    QTextCursor cursor = this->textCursor();
    QString selectedText = cursor.selectedText();

    if (!selectedText.isEmpty()) {
        // Start the selection at start of the first block of the selection
        int end = cursor.selectionEnd();
        cursor.setPosition(cursor.selectionStart());
        cursor.movePosition(QTextCursor::StartOfBlock, QTextCursor::MoveAnchor);
        cursor.setPosition(end, QTextCursor::KeepAnchor);
        this->setTextCursor(cursor);
        selectedText = cursor.selectedText();

        // we need this strange newline character we are getting in the
        // selected text for newlines
        const QString newLine =
            QString::fromUtf8(QByteArray::fromHex(QByteArrayLiteral("e280a9")));
        QString newText;

        if (reverse) {
            // un-indent text

            //          QSettings settings;
            const int indentSize = indentCharacters == QStringLiteral("\t")
                                       ? 4
                                       : indentCharacters.length();

            // remove leading \t or spaces in following lines
            newText = selectedText.replace(
                QRegularExpression(newLine + QStringLiteral("(\\t| {1,") +
                                   QString::number(indentSize) +
                                   QStringLiteral("})")),
                QStringLiteral("\n"));

            // remove leading \t or spaces in first line
            newText.remove(QRegularExpression(QStringLiteral("^(\\t| {1,") +
                                              QString::number(indentSize) +
                                              QStringLiteral("})")));
        } else {
            // replace trailing new line to prevent an indent of the line after
            // the selection
            newText = selectedText.replace(
                QRegularExpression(QRegularExpression::escape(newLine) +
                                   QStringLiteral("$")),
                QStringLiteral("\n"));

            // indent text
            newText.replace(newLine, QStringLiteral("\n") + indentCharacters)
                .prepend(indentCharacters);

            // remove trailing \t
            newText.remove(QRegularExpression(QStringLiteral("\\t$")));
        }

        // insert the new text
        cursor.insertText(newText);

        // update the selection to the new text
        cursor.setPosition(cursor.position() - newText.size(),
                           QTextCursor::KeepAnchor);
        this->setTextCursor(cursor);

        return true;
    } else if (reverse) {
        const int indentSize = indentCharacters.length();

        // do the check as often as we have characters to un-indent
        for (int i = 1; i <= indentSize; i++) {
            // if nothing was selected but we want to reverse the indention
            // check if there is a \t in front or after the cursor and remove it
            // if so
            const int position = cursor.position();

            if (!cursor.atStart()) {
                // get character in front of cursor
                cursor.setPosition(position - 1, QTextCursor::KeepAnchor);
            }

            // check for \t or space in front of cursor
            QRegularExpression re(QStringLiteral("[\\t ]"));
            QRegularExpressionMatch match = re.match(cursor.selectedText());

            if (!match.hasMatch()) {
                // (select to) check for \t or space after the cursor
                cursor.setPosition(position);

                if (!cursor.atEnd()) {
                    cursor.setPosition(position + 1, QTextCursor::KeepAnchor);
                }
            }

            match = re.match(cursor.selectedText());

            if (match.hasMatch()) {
                cursor.removeSelectedText();
            }

            cursor = this->textCursor();
        }

        return true;
    }

    // else just insert indentCharacters
    cursor.insertText(indentCharacters);

    return true;
}